

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

char * BuildModuleFromPath(Allocator *allocator,InplaceStr moduleName,char *moduleRoot,
                          bool addExtension,char **errorPos,char *errorBuf,uint errorBufSize,
                          int optimizationLevel,ArrayView<InplaceStr> activeImports,
                          CompilerStatistics *statistics)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  bool addExtension_00;
  char *__haystack;
  undefined7 in_register_00000081;
  TraceScope traceScope;
  char path [1024];
  char nextModuleRootBuf [1024];
  uint local_874;
  char *local_870;
  undefined4 local_864;
  ulong local_860;
  char **local_858;
  Allocator *local_850;
  TraceScope local_848;
  char local_838 [1024];
  char local_438 [1032];
  
  pcVar8 = moduleName.end;
  __haystack = moduleName.begin;
  local_870 = moduleRoot;
  local_850 = allocator;
  if (statistics == (CompilerStatistics *)0x0) {
    NULLC::TraceDump();
  }
  else {
    uVar4 = NULLCTime::clockMicro();
    statistics->startTime = uVar4;
    statistics->finishTime = 0;
    NULLC::TraceDump();
    uVar4 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(statistics,"Tracing",uVar4);
    uVar4 = NULLCTime::clockMicro();
    statistics->startTime = uVar4;
    statistics->finishTime = 0;
  }
  local_864 = (undefined4)CONCAT71(in_register_00000081,addExtension);
  if ((BuildModuleFromPath(Allocator*,InplaceStr,char_const*,bool,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
       ::token == '\0') &&
     (iVar5 = __cxa_guard_acquire(&BuildModuleFromPath(Allocator*,InplaceStr,char_const*,bool,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
                                   ::token), iVar5 != 0)) {
    BuildModuleFromPath::token = NULLC::TraceGetToken("compiler","BuildModuleFromPath");
    __cxa_guard_release(&BuildModuleFromPath(Allocator*,InplaceStr,char_const*,bool,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
                         ::token);
  }
  NULLC::TraceScope::TraceScope(&local_848,BuildModuleFromPath::token);
  lVar3 = NULLC::traceContext;
  local_860 = (long)pcVar8 - (long)__haystack;
  if ((int)local_860 != 0) {
    uVar4 = (int)local_860 + 1;
    if ((*(uint *)(NULLC::traceContext + 0x264) <= *(int *)(NULLC::traceContext + 0x260) + uVar4) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
    }
    local_858 = errorPos;
    if (*(uint *)(lVar3 + 0x264) <= uVar4) {
      __assert_fail("count + 1 < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
    }
    uVar1 = *(uint *)(lVar3 + 0x260);
    iVar5 = (int)local_860;
    memcpy((void *)((ulong)uVar1 + *(long *)(lVar3 + 0x268)),__haystack,local_860 & 0xffffffff);
    *(undefined1 *)(*(long *)(lVar3 + 0x268) + (ulong)(uint)(*(int *)(lVar3 + 0x260) + iVar5)) = 0;
    *(int *)(lVar3 + 0x260) = *(int *)(lVar3 + 0x260) + uVar4;
    lVar2 = *(long *)(lVar3 + 0x278);
    uVar4 = *(uint *)(lVar3 + 0x270);
    *(uint *)(lVar3 + 0x270) = uVar4 + 1;
    *(uint *)(lVar2 + (ulong)uVar4 * 8) = uVar1 * 4 + 2;
    *(undefined4 *)(lVar2 + 4 + (ulong)uVar4 * 8) = 0;
    errorPos = local_858;
  }
  if (*pcVar8 != '\0') {
    __assert_fail("*moduleName.end == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                  ,0x882,
                  "char *BuildModuleFromPath(Allocator *, InplaceStr, const char *, bool, const char **, char *, unsigned int, int, ArrayView<InplaceStr>, CompilerStatistics *)"
                 );
  }
  pcVar6 = strstr(__haystack,".nc");
  addExtension_00 = SUB41(local_864,0);
  if (addExtension_00 == false) {
    if (pcVar6 == (char *)0x0) {
      __assert_fail("strstr(moduleName.begin, \".nc\") != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                    ,0x887,
                    "char *BuildModuleFromPath(Allocator *, InplaceStr, const char *, bool, const char **, char *, unsigned int, int, ArrayView<InplaceStr>, CompilerStatistics *)"
                   );
    }
  }
  else if (pcVar6 != (char *)0x0) {
    __assert_fail("strstr(moduleName.begin, \".nc\") == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                  ,0x885,
                  "char *BuildModuleFromPath(Allocator *, InplaceStr, const char *, bool, const char **, char *, unsigned int, int, ArrayView<InplaceStr>, CompilerStatistics *)"
                 );
  }
  local_874 = 0;
  if (local_870 == (char *)0x0) {
    pcVar6 = (char *)0x0;
    local_870 = (char *)0x0;
  }
  else {
    pcVar6 = FindFileContentInImportPaths
                       (moduleName,local_870,addExtension_00,local_838,0x400,&local_874);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      if (__haystack == pcVar8) {
        pcVar9 = (char *)0x0;
      }
      else {
        pcVar7 = pcVar8;
        do {
          pcVar7 = pcVar7 + -1;
          pcVar9 = (char *)0x0;
          if (pcVar7 < __haystack) break;
          pcVar9 = pcVar7;
        } while (*pcVar7 != '/');
      }
      if (pcVar9 != (char *)0x0) {
        NULLC::SafeSprintf(local_438,0x400,"%s/%.*s",local_870,
                           (ulong)(uint)((int)pcVar9 - (int)moduleName.begin),__haystack);
        local_870 = local_438;
      }
    }
  }
  if (pcVar6 == (char *)0x0) {
    pcVar6 = FindFileContentInImportPaths
                       (moduleName,(char *)0x0,addExtension_00,local_838,0x400,&local_874);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      if (__haystack == pcVar8) {
        pcVar9 = (char *)0x0;
      }
      else {
        do {
          pcVar8 = pcVar8 + -1;
          pcVar9 = (char *)0x0;
          if (pcVar8 < __haystack) break;
          pcVar9 = pcVar8;
        } while (*pcVar8 != '/');
      }
      if (pcVar9 != (char *)0x0) {
        local_870 = local_438;
        NULLC::SafeSprintf(local_870,0x400,"%.*s",(ulong)(uint)((int)pcVar9 - (int)moduleName.begin)
                           ,__haystack);
      }
    }
  }
  if (statistics != (CompilerStatistics *)0x0) {
    uVar4 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(statistics,"Extra",uVar4);
  }
  if (pcVar6 == (char *)0x0) {
    *errorPos = (char *)0x0;
    if (errorBufSize == 0 || errorBuf == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar8 = (char *)0x0;
      NULLC::SafeSprintf(errorBuf,(ulong)errorBufSize,
                         "ERROR: module file \'%.*s\' could not be opened",local_860,__haystack);
    }
  }
  else {
    pcVar8 = BuildModuleFromSource
                       (local_850,local_838,local_870,pcVar6,local_874,errorPos,errorBuf,
                        errorBufSize,optimizationLevel,activeImports,statistics);
    (*(code *)NULLC::fileFree)(pcVar6);
  }
  NULLC::TraceScope::~TraceScope(&local_848);
  return pcVar8;
}

Assistant:

char* BuildModuleFromPath(Allocator *allocator, InplaceStr moduleName, const char *moduleRoot, bool addExtension, const char **errorPos, char *errorBuf, unsigned errorBufSize, int optimizationLevel, ArrayView<InplaceStr> activeImports, CompilerStatistics *statistics)
{
	if(statistics)
		statistics->Start(NULLCTime::clockMicro());

	NULLC::TraceDump();

	if(statistics)
	{
		statistics->Finish("Tracing", NULLCTime::clockMicro());
		statistics->Start(NULLCTime::clockMicro());
	}

	TRACE_SCOPE("compiler", "BuildModuleFromPath");
	TRACE_LABEL2(moduleName.begin, moduleName.end);

	assert(*moduleName.end == 0);

	if(addExtension)
		assert(strstr(moduleName.begin, ".nc") == NULL);
	else
		assert(strstr(moduleName.begin, ".nc") != NULL);

	const unsigned nextModuleRootLength = 1024;
	char nextModuleRootBuf[nextModuleRootLength];

	const char *nextModuleRoot = moduleRoot;

	const unsigned pathLength = 1024;
	char path[pathLength];

	unsigned fileSize = 0;
	const char *fileContent = NULL;

	if(moduleRoot)
	{
		fileContent = FindFileContentInImportPaths(moduleName, moduleRoot, addExtension, path, pathLength, fileSize);

		if(fileContent)
		{
			if(const char *pos = moduleName.rfind('/'))
			{
				NULLC::SafeSprintf(nextModuleRootBuf, nextModuleRootLength, "%s/%.*s", moduleRoot, unsigned(pos - moduleName.begin), moduleName.begin);

				nextModuleRoot = nextModuleRootBuf;
			}
		}
	}

	if(!fileContent)
	{
		fileContent = FindFileContentInImportPaths(moduleName, NULL, addExtension, path, pathLength, fileSize);

		if(fileContent)
		{
			if(const char *pos = moduleName.rfind('/'))
			{
				NULLC::SafeSprintf(nextModuleRootBuf, nextModuleRootLength, "%.*s", unsigned(pos - moduleName.begin), moduleName.begin);

				nextModuleRoot = nextModuleRootBuf;
			}
		}
	}

	if(statistics)
		statistics->Finish("Extra", NULLCTime::clockMicro());

	if(!fileContent)
	{
		*errorPos = NULL;

		if(errorBuf && errorBufSize)
			NULLC::SafeSprintf(errorBuf, errorBufSize, "ERROR: module file '%.*s' could not be opened", moduleName.length(), moduleName.begin);

		return NULL;
	}

	char *bytecode = BuildModuleFromSource(allocator, path, nextModuleRoot, fileContent, fileSize, errorPos, errorBuf, errorBufSize, optimizationLevel, activeImports, statistics);

	NULLC::fileFree(fileContent);

	return bytecode;
}